

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O1

void __thiscall
google::protobuf::internal::cleanup::ChunkList::AddFallback
          (ChunkList *this,void *elem,_func_void_void_ptr *destructor,SerialArena *arena)

{
  size_t sVar1;
  Chunk *pCVar2;
  void *pvVar3;
  Nonnull<const_char_*> pcVar4;
  ulong uVar5;
  AllocationPolicy *policy;
  size_t size;
  long in_FS_OFFSET;
  SizedPtr SVar6;
  
  if (this->next_ == this->limit_) {
    pcVar4 = (Nonnull<const_char_*>)0x0;
  }
  else {
    pcVar4 = absl::lts_20250127::log_internal::MakeCheckOpString<void_const*,void_const*>
                       (this->next_,this->limit_,"next_ == limit_");
  }
  if (pcVar4 == (Nonnull<const_char_*>)0x0) {
    policy = (AllocationPolicy *)((arena->parent_->alloc_policy_).policy_ & 0xfffffffffffffff8);
    if (this->head_ == (Chunk *)0x0) {
      sVar1 = 0;
    }
    else {
      sVar1 = this->head_->size;
    }
    uVar5 = 0x1000;
    if (sVar1 * 2 < 0x1000) {
      uVar5 = sVar1 * 2;
    }
    size = 0x40;
    if (sVar1 != 0) {
      size = uVar5;
    }
    if (policy == (AllocationPolicy *)0x0) {
      if (*(code **)(in_FS_OFFSET + -0x48) == (code *)0x0) {
        pvVar3 = operator_new(size);
        SVar6.n = size;
        SVar6.p = pvVar3;
      }
      else {
        SVar6 = (SizedPtr)
                (**(code **)(in_FS_OFFSET + -0x48))(size,*(undefined8 *)(in_FS_OFFSET + -0x40));
      }
    }
    else {
      SVar6 = anon_unknown_12::AllocateMemory(policy,size);
    }
    sVar1 = SVar6.n;
    pCVar2 = (Chunk *)SVar6.p;
    (arena->space_allocated_).super___atomic_base<unsigned_long>._M_i =
         (arena->space_allocated_).super___atomic_base<unsigned_long>._M_i + sVar1;
    pCVar2->next = this->head_;
    pCVar2->size = sVar1;
    this->head_ = pCVar2;
    this->prefetch_ptr_ = (char *)(pCVar2 + 1);
    this->limit_ = (CleanupNode *)((long)&pCVar2[1].next + (sVar1 - 0x10 & 0xfffffffffffffff0));
    this->next_ = (CleanupNode *)(pCVar2 + 2);
    pCVar2[1].next = (Chunk *)elem;
    pCVar2[1].size = (size_t)destructor;
    return;
  }
  AddFallback();
}

Assistant:

void ChunkList::AddFallback(
    void* PROTOBUF_NONNULL elem,
    void (*PROTOBUF_NONNULL destructor)(void* PROTOBUF_NONNULL),
    SerialArena& arena) {
  ABSL_DCHECK_EQ(next_, limit_);
  SizedPtr mem = AllocateCleanupChunk(arena.parent_.AllocPolicy(),
                                      head_ == nullptr ? 0 : head_->size);
  arena.AddSpaceAllocated(mem.n);
  head_ = new (mem.p) Chunk{head_, mem.n};
  next_ = head_->First();
  prefetch_ptr_ = reinterpret_cast<char*>(next_);
  limit_ = next_ + Chunk::Capacity(mem.n);
  AddFromExisting(elem, destructor);
}